

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FillStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_fillstatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  FillStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_fillstatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_fillstatic(this);
    this_00 = (FillStaticLayerParams *)operator_new(0x30);
    FillStaticLayerParams::FillStaticLayerParams(this_00);
    (this->layer_).fillstatic_ = this_00;
  }
  return (FillStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FillStaticLayerParams* NeuralNetworkLayer::mutable_fillstatic() {
  if (!has_fillstatic()) {
    clear_layer();
    set_has_fillstatic();
    layer_.fillstatic_ = new ::CoreML::Specification::FillStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillStatic)
  return layer_.fillstatic_;
}